

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

void __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::dump(iterator *this,ostream *os)

{
  ostream *poVar1;
  long lVar2;
  uint uVar3;
  __extent_storage<18446744073709551615UL> in_RCX;
  ostream *poVar5;
  _Map_pointer ppsVar6;
  span<const_std::byte,_18446744073709551615UL> key;
  span<const_std::byte,_18446744073709551615UL> key_00;
  undefined1 local_88 [8];
  stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
  tmp;
  __extent_storage<18446744073709551615UL> _Var4;
  
  if ((this->stack_).c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stack_).c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"keybuf=",7);
    key._M_extent._M_extent_value = in_RCX._M_extent_value;
    key._M_ptr = (pointer)(this->keybuf_).off;
    detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
              ((detail *)os,(ostream *)(this->keybuf_).buf,key);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    std::
    deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
    ::deque((deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             *)local_88,&(this->stack_).c);
    if (tmp.c.
        super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node !=
        (_Map_pointer)
        tmp.c.
        super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_map_size) {
      do {
        ppsVar6 = tmp.c.
                  super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        if ((_Elt_pointer)
            tmp.c.
            super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node ==
            tmp.c.
            super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          ppsVar6 = (_Map_pointer)
                    (tmp.c.
                     super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].version + 0x200);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"iter::stack:: level = ",0x16);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", key_byte=0x",0xd);
        lVar2 = *(long *)poVar1;
        *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar5 = poVar1 + *(long *)(lVar2 + -0x18);
        if (poVar1[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar5);
          poVar5[0xe1] = (ostream)0x1;
          lVar2 = *(long *)poVar1;
        }
        poVar5[0xe0] = (ostream)0x30;
        *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", child_index=0x",0x10);
        lVar2 = *(long *)poVar1;
        *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar5 = poVar1 + *(long *)(lVar2 + -0x18);
        if (poVar1[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar5);
          poVar5[0xe1] = (ostream)0x1;
          lVar2 = *(long *)poVar1;
        }
        poVar5[0xe0] = (ostream)0x30;
        *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        uVar3 = *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        _Var4._M_extent_value = (size_t)uVar3;
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) = uVar3;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", prefix(",9);
        tmp.c.
        super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node =
             (_Map_pointer)
             CONCAT71(tmp.c.
                      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node._1_7_,
                      *(undefined1 *)((long)ppsVar6 + -9));
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,(char *)&tmp.c.
                                            super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,")=",2);
        key_00._M_ptr = (pointer)(ulong)*(byte *)((long)ppsVar6 + -9);
        key_00._M_extent._M_extent_value = _Var4._M_extent_value;
        detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
                  ((detail *)os,(ostream *)(ppsVar6 + -2),key_00);
        std::__ostream_insert<char,std::char_traits<char>>(os,", version=",10);
        tmp.c.
        super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)ppsVar6[-1];
        optimistic_lock::version_type::dump
                  ((version_type *)
                   &tmp.c.
                    super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,os);
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        detail::
        basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
        ::dump_node(os,(basic_node_ptr<unodb::detail::olc_node_header> *)(ppsVar6 + -4),false);
        if ((((basic_node_ptr<unodb::detail::olc_node_header> *)(ppsVar6 + -4))->tagged_ptr & 7) !=
            0) {
          tmp.c.
          super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               CONCAT71(tmp.c.
                        super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(char *)&tmp.c.
                                 super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_node,1);
        }
        if ((_Elt_pointer)
            tmp.c.
            super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node ==
            tmp.c.
            super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          operator_delete(tmp.c.
                          super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur,0x200);
          tmp.c.
          super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur =
               (_Elt_pointer)
               tmp.c.
               super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].version;
          tmp.c.
          super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first =
               tmp.c.
               super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur + 0x10;
          tmp.c.
          super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node =
               (_Map_pointer)
               (tmp.c.
                super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur + 0xf);
          tmp.c.
          super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last =
               (_Elt_pointer)
               &tmp.c.
                super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].version;
        }
        else {
          tmp.c.
          super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node =
               tmp.c.
               super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node + -4;
        }
      } while (tmp.c.
               super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node !=
               (_Map_pointer)
               tmp.c.
               super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
               ._M_impl.super__Deque_impl_data._M_map_size);
    }
    std::
    _Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
    ::~_Deque_base((_Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                    *)local_88);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"iter::stack:: empty\n",0x14);
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream& os) const {
      if (empty()) {
        os << "iter::stack:: empty\n";
        return;
      }
      // Dump the key buffer maintained by the iterator.
      os << "keybuf=";
      detail::dump_key(os, keybuf_.get_key_view());
      os << "\n";
      // Create a new stack and copy everything there.  Using the new
      // stack, print out the stack in top-bottom order.  This avoids
      // modifications to the existing stack for the iterator.
      auto tmp = stack_;
      auto level = tmp.size() - 1;
      while (!tmp.empty()) {
        const auto& e = tmp.top();
        const auto& np = e.node;
        os << "iter::stack:: level = " << level << ", key_byte=0x" << std::hex
           << std::setfill('0') << std::setw(2)
           << static_cast<uint64_t>(e.key_byte) << std::dec
           << ", child_index=0x" << std::hex << std::setfill('0')
           << std::setw(2) << static_cast<std::uint64_t>(e.child_index)
           << std::dec << ", prefix(" << e.prefix.length() << ")=";
        detail::dump_key(os, e.prefix.get_key_view());
        os << ", version=";
        optimistic_lock::version_type(e.version).dump(os);  // version tag.
        os << ", ";
        art_policy::dump_node(os, np, false /*recursive*/);  // node or leaf.
        if (np.type() != node_type::LEAF) os << '\n';
        tmp.pop();
        level--;
      }
    }